

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::call(Simulator *this,PCode *code)

{
  mapped_type *pmVar1;
  bool local_ce;
  allocator local_cd;
  int local_cc;
  string local_c8;
  Symbol local_a8;
  
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
           ::operator[](&this->func_table_,&code->first_);
  ScopeTree::push(&this->tree_);
  std::__cxx11::string::string((string *)&local_c8,"__ret__",&local_cd);
  local_cc = this->eip_ + 1;
  local_ce = true;
  Symbol::Symbol(&local_a8,&local_c8,&local_cc,&local_ce);
  ScopeTree::define(&this->tree_,&local_a8);
  Symbol::~Symbol(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  this->eip_ = pmVar1->first + 1;
  return;
}

Assistant:

void Simulator::call(const PCode &code) {
    const std::pair<int, int> &func_pos = func_table_[code.first()];
    tree_.push();
    tree_.define(Symbol("__ret__", eip() + 1, true));
    set_eip(func_pos.first + 1);
}